

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gameplay.cpp
# Opt level: O0

void __thiscall Gameplay::ArrangeTurns(Gameplay *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  pointer pPVar4;
  _Self *__a;
  _Self local_38;
  _Self local_30;
  _List_node_base *local_28;
  _List_iterator<Player> local_20;
  iterator i;
  iterator max;
  Gameplay *this_local;
  
  std::_List_iterator<Player>::_List_iterator(&i);
  std::_List_iterator<Player>::_List_iterator(&local_20);
  local_28 = (_List_node_base *)
             std::__cxx11::list<Player,_std::allocator<Player>_>::begin(&this->players);
  (this->it)._M_node = local_28;
  while( true ) {
    local_30._M_node =
         (_List_node_base *)std::__cxx11::list<Player,_std::allocator<Player>_>::end(&this->players)
    ;
    bVar1 = std::operator!=(&this->it,&local_30);
    if (!bVar1) break;
    i._M_node = (this->it)._M_node;
    local_20._M_node = (this->it)._M_node;
    while( true ) {
      local_38._M_node =
           (_List_node_base *)
           std::__cxx11::list<Player,_std::allocator<Player>_>::end(&this->players);
      bVar1 = std::operator!=(&local_20,&local_38);
      if (!bVar1) break;
      pPVar4 = std::_List_iterator<Player>::operator->(&local_20);
      iVar2 = Player::getHonour(pPVar4);
      pPVar4 = std::_List_iterator<Player>::operator->(&i);
      iVar3 = Player::getHonour(pPVar4);
      if (iVar3 < iVar2) {
        i._M_node = local_20._M_node;
      }
      std::_List_iterator<Player>::operator++(&local_20,0);
    }
    __a = std::_List_iterator<Player>::operator--(&this->it);
    std::swap<std::_List_iterator<Player>>(__a,&i);
    std::_List_iterator<Player>::operator++(&this->it,0);
  }
  return;
}

Assistant:

void Gameplay::ArrangeTurns()                                   //selection sorting in decreasing order players list by honour
{
    list <Player>::iterator max, i;

    for (it=players.begin(); it!=players.end(); it++)
    {
        max = it;
        for (i=it; i!=players.end(); i++)
        {
            if (i->getHonour() > max->getHonour())
                max = i;
        }
        swap(--it, max);
    }
}